

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultVoice(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  type_conflict4 tVar1;
  element_type *peVar2;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  int local_c8 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::InlineQueryResultVoice> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::InlineQueryResultVoice>();
  this_00 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_78,"voice_url",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_48,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)this_00,&local_78);
  peVar2 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar2->voiceUrl,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_78);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_c0,"voice_duration",0x2e);
  local_c8[0] = 0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(local_20,&local_c0,local_c8);
  peVar2 = std::
           __shared_ptr_access<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2->voiceDuration = tVar1;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_c0);
  PVar3.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::InlineQueryResultVoice,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultVoice::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultVoice(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultVoice>());
    result->voiceUrl = data.get<string>("voice_url");
    result->voiceDuration = data.get<int32_t>("voice_duration", 0);
    return result;
}